

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O0

void __thiscall
cmTestGenerator::GenerateScriptActions(cmTestGenerator *this,ostream *os,Indent *indent)

{
  Indent *indent_local;
  ostream *os_local;
  cmTestGenerator *this_local;
  
  if (((this->super_cmScriptGenerator).ActionsPerConfig & 1U) == 0) {
    GenerateOldStyle(this,os,indent);
  }
  else {
    cmScriptGenerator::GenerateScriptActions(&this->super_cmScriptGenerator,os,indent);
  }
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptActions(std::ostream& os,
                                            Indent const& indent)
{
  if(this->ActionsPerConfig)
    {
    // This is the per-config generation in a single-configuration
    // build generator case.  The superclass will call our per-config
    // method.
    this->cmScriptGenerator::GenerateScriptActions(os, indent);
    }
  else
    {
    // This is an old-style test, so there is only one config.
    //assert(this->Test->GetOldStyle());
    this->GenerateOldStyle(os, indent);
    }
}